

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::DrawPlotBackground(PPlot *this,PRect *inRect,Painter *inPainter)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  int theY;
  int theX;
  string local_48 [4];
  int theW;
  string theTitle;
  PColor theC;
  Painter *inPainter_local;
  PRect *inRect_local;
  PPlot *this_local;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mPlotBackground).mStyle);
  if (((this->mPlotBackground).mTransparent & 1U) == 0) {
    theTitle.field_2._13_1_ = (this->mPlotBackground).mPlotRegionBackColor.mR;
    theTitle.field_2._14_1_ = (this->mPlotBackground).mPlotRegionBackColor.mG;
    theTitle.field_2._M_local_buf[0xf] = (this->mPlotBackground).mPlotRegionBackColor.mB;
    (*inPainter->_vptr_Painter[7])
              (inPainter,(ulong)(byte)theTitle.field_2._13_1_,(ulong)(byte)theTitle.field_2._14_1_,
               (ulong)(byte)theTitle.field_2._M_local_buf[0xf]);
    (*inPainter->_vptr_Painter[1])
              (inPainter,inRect->mX & 0xffffffff,inRect->mY & 0xffffffff,inRect->mW & 0xffffffff,
               inRect->mH & 0xffffffff);
  }
  std::__cxx11::string::string(local_48,(string *)&(this->mPlotBackground).mTitle);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,uVar5);
    uVar3 = Round((float)((double)(inRect->mW - (long)iVar2) * 0.5 + (double)inRect->mX));
    lVar4 = inRect->mY;
    iVar2 = (*inPainter->_vptr_Painter[9])();
    lVar1 = (this->mMargins).mTop;
    uVar5 = std::__cxx11::string::c_str();
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)uVar3,(ulong)(uint)(((int)lVar4 - iVar2) + (int)lVar1),uVar5);
  }
  std::__cxx11::string::~string(local_48);
  return true;
}

Assistant:

bool PPlot::DrawPlotBackground (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mPlotBackground.mStyle);

      if (!mPlotBackground.mTransparent) {
        PColor theC = mPlotBackground.mPlotRegionBackColor;
        inPainter.SetFillColor (theC.mR, theC.mG, theC.mB);
        inPainter.FillRect (inRect.mX, inRect.mY, inRect.mW, inRect.mH);
      }
      string theTitle = mPlotBackground.mTitle;
      if (theTitle.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theTitle.c_str ());
        int theX = Round (inRect.mX + (inRect.mW-theW)*0.5);
        int theY = inRect.mY - inPainter.GetFontHeight ()+mMargins.mTop;
        inPainter.DrawText (theX, theY, theTitle.c_str ());
      }
      return true;
    }